

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int expbuf_write(expbuf_t *buf,int fd)

{
  int *piVar1;
  bool bVar2;
  void *local_60;
  ssize_t r;
  void *pvStack_50;
  int vecindex;
  size_t bufsz;
  iovec vecs [2];
  int fd_local;
  expbuf_t *buf_local;
  
  memset(&bufsz,0,0x20);
  pvStack_50 = (void *)expbuf_size(buf);
  bufsz = (size_t)&stack0xffffffffffffffb0;
  vecs[0].iov_base = (void *)0x8;
  vecs[0].iov_len = (size_t)buf->start;
  r._4_4_ = 0;
  vecs[1].iov_base = pvStack_50;
  while( true ) {
    if (r._4_4_ == 2) {
      return 0;
    }
    do {
      local_60 = (void *)writev(fd,(iovec *)&vecs[(long)r._4_4_ + -1].iov_len,2 - r._4_4_);
      bVar2 = false;
      if (local_60 == (void *)0xffffffffffffffff) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (local_60 == (void *)0xffffffffffffffff) break;
    if (local_60 == (void *)0x0) {
      __assert_fail("r != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/neverbleed/neverbleed.c"
                    ,0xfc,"int expbuf_write(struct expbuf_t *, int)");
    }
    while( true ) {
      bVar2 = false;
      if (local_60 != (void *)0x0) {
        bVar2 = vecs[r._4_4_].iov_base <= local_60;
      }
      if (!bVar2) break;
      local_60 = (void *)((long)local_60 - (long)vecs[r._4_4_].iov_base);
      r._4_4_ = r._4_4_ + 1;
    }
    if (local_60 != (void *)0x0) {
      vecs[(long)r._4_4_ + -1].iov_len = vecs[(long)r._4_4_ + -1].iov_len + (long)local_60;
      vecs[r._4_4_].iov_base = (void *)((long)vecs[r._4_4_].iov_base - (long)local_60);
    }
  }
  return -1;
}

Assistant:

static int expbuf_write(struct expbuf_t *buf, int fd)
{
    struct iovec vecs[2] = {{NULL}};
    size_t bufsz = expbuf_size(buf);
    int vecindex;
    ssize_t r;

    vecs[0].iov_base = &bufsz;
    vecs[0].iov_len = sizeof(bufsz);
    vecs[1].iov_base = buf->start;
    vecs[1].iov_len = bufsz;

    for (vecindex = 0; vecindex != sizeof(vecs) / sizeof(vecs[0]);) {
        while ((r = writev(fd, vecs + vecindex, sizeof(vecs) / sizeof(vecs[0]) - vecindex)) == -1 && errno == EINTR)
            ;
        if (r == -1)
            return -1;
        assert(r != 0);
        while (r != 0 && r >= vecs[vecindex].iov_len) {
            r -= vecs[vecindex].iov_len;
            ++vecindex;
        }
        if (r != 0) {
            vecs[vecindex].iov_base = (char *)vecs[vecindex].iov_base + r;
            vecs[vecindex].iov_len -= r;
        }
    }

    return 0;
}